

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int __thiscall ncnn::Reduction::load_param(Reduction *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  Mat MStack_98;
  Mat local_58;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->operation = iVar1;
  iVar1 = ParamDict::get(pd,1,1);
  this->reduce_all = iVar1;
  fVar2 = ParamDict::get(pd,2,1.0);
  this->coeff = fVar2;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&MStack_98,pd,3,&local_58);
  Mat::operator=(&this->axes,&MStack_98);
  Mat::~Mat(&MStack_98);
  Mat::~Mat(&local_58);
  iVar1 = ParamDict::get(pd,4,0);
  this->keepdims = iVar1;
  return 0;
}

Assistant:

int Reduction::load_param(const ParamDict& pd)
{
    operation = pd.get(0, 0);
    reduce_all = pd.get(1, 1);
    coeff = pd.get(2, 1.f);
    axes = pd.get(3, Mat());
    keepdims = pd.get(4, 0);

    return 0;
}